

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

position_type __thiscall
io::posix::file::seek(file *this,offset_type offset,seek_mode from,error_code *ec)

{
  error_category *peVar1;
  int *piVar2;
  position_type pVar3;
  int __whence;
  
  peVar1 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar1;
  piVar2 = __errno_location();
  *piVar2 = 0;
  __whence = -1;
  if (from < (current|end)) {
    __whence = *(int *)(&DAT_0010828c + (ulong)from * 4);
  }
  pVar3.pos_ = lseek((this->fd_).fd_,offset,__whence);
  if (pVar3.pos_ < 0) {
    ec->_M_value = *piVar2;
    ec->_M_cat = peVar1;
    pVar3.pos_ = 0;
  }
  return (position_type)pVar3.pos_;
}

Assistant:

position_type
    seek(offset_type offset, seek_mode from, std::error_code& ec) noexcept
    {
        ec.clear();
        errno = 0;
        auto o = ::lseek(native_handle(), static_cast<off_t>(offset),
                         detail::seek_mode_to_whence_arg(from));

        if (o < 0) {
            ec.assign(errno, std::system_category());
            return position_type{};
        }

        return position_type{o};
    }